

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_poll(LIBSSH2_POLLFD *fds,uint nfds,long timeout)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  undefined1 local_870 [8];
  timeval tv_end;
  timeval tv_begin;
  int sysret;
  pollfd sockets [256];
  LIBSSH2_SESSION *local_40;
  LIBSSH2_SESSION *session;
  uint active_fds;
  uint i;
  long timeout_remaining;
  long timeout_local;
  uint nfds_local;
  LIBSSH2_POLLFD *fds_local;
  
  local_40 = (LIBSSH2_SESSION *)0x0;
  if (nfds < 0x101) {
    for (session._4_4_ = 0; _active_fds = timeout, session._4_4_ < nfds;
        session._4_4_ = session._4_4_ + 1) {
      fds[session._4_4_].revents = 0;
      uVar1 = fds[session._4_4_].type;
      if (uVar1 == '\x01') {
        *(libssh2_socket_t *)(&stack0xfffffffffffff7b8 + (ulong)session._4_4_ * 8) =
             fds[session._4_4_].fd.socket;
        sockets[(ulong)session._4_4_ - 1].events = (short)fds[session._4_4_].events;
        sockets[(ulong)session._4_4_ - 1].revents = 0;
      }
      else if (uVar1 == '\x02') {
        *(libssh2_socket_t *)(&stack0xfffffffffffff7b8 + (ulong)session._4_4_ * 8) =
             (fds[session._4_4_].fd.channel)->session->socket_fd;
        sockets[(ulong)session._4_4_ - 1].events = 1;
        sockets[(ulong)session._4_4_ - 1].revents = 0;
        if (local_40 == (LIBSSH2_SESSION *)0x0) {
          local_40 = (fds[session._4_4_].fd.channel)->session;
        }
      }
      else {
        if (uVar1 != '\x03') {
          if (local_40 != (LIBSSH2_SESSION *)0x0) {
            _libssh2_error(local_40,-0x23,"Invalid descriptor passed to libssh2_poll()");
          }
          return -1;
        }
        *(libssh2_socket_t *)(&stack0xfffffffffffff7b8 + (ulong)session._4_4_ * 8) =
             (fds[session._4_4_].fd.listener)->session->socket_fd;
        sockets[(ulong)session._4_4_ - 1].events = 1;
        sockets[(ulong)session._4_4_ - 1].revents = 0;
        if (local_40 == (LIBSSH2_SESSION *)0x0) {
          local_40 = (fds[session._4_4_].fd.listener)->session;
        }
      }
    }
    do {
      session._0_4_ = 0;
      for (session._4_4_ = 0; session._4_4_ < nfds; session._4_4_ = session._4_4_ + 1) {
        if (fds[session._4_4_].events != fds[session._4_4_].revents) {
          if (fds[session._4_4_].type == '\x02') {
            if (((fds[session._4_4_].events & 1) != 0) && ((fds[session._4_4_].revents & 1) == 0)) {
              iVar3 = libssh2_poll_channel_read(fds[session._4_4_].fd.channel,0);
              fds[session._4_4_].revents =
                   (long)(int)(uint)(iVar3 != 0) | fds[session._4_4_].revents;
            }
            if (((fds[session._4_4_].events & 2) != 0) && ((fds[session._4_4_].revents & 2) == 0)) {
              iVar3 = libssh2_poll_channel_read(fds[session._4_4_].fd.channel,1);
              iVar2 = 0;
              if (iVar3 != 0) {
                iVar2 = 2;
              }
              fds[session._4_4_].revents = (long)iVar2 | fds[session._4_4_].revents;
            }
            if (((fds[session._4_4_].events & 4) != 0) && ((fds[session._4_4_].revents & 4) == 0)) {
              iVar3 = poll_channel_write(fds[session._4_4_].fd.channel);
              iVar2 = 0;
              if (iVar3 != 0) {
                iVar2 = 4;
              }
              fds[session._4_4_].revents = (long)iVar2 | fds[session._4_4_].revents;
            }
            if ((((fds[session._4_4_].fd.channel)->remote).close != '\0') ||
               (((fds[session._4_4_].fd.channel)->local).close != '\0')) {
              fds[session._4_4_].revents = fds[session._4_4_].revents | 0x80;
            }
            if ((fds[session._4_4_].fd.channel)->session->socket_state == -1) {
              fds[session._4_4_].revents = fds[session._4_4_].revents | 0x90;
            }
          }
          else if (fds[session._4_4_].type == '\x03') {
            if (((fds[session._4_4_].events & 1) != 0) && ((fds[session._4_4_].revents & 1) == 0)) {
              iVar3 = poll_listener_queued(fds[session._4_4_].fd.listener);
              fds[session._4_4_].revents =
                   (long)(int)(uint)(iVar3 != 0) | fds[session._4_4_].revents;
            }
            if ((fds[session._4_4_].fd.listener)->session->socket_state == -1) {
              fds[session._4_4_].revents = fds[session._4_4_].revents | 0x90;
            }
          }
        }
        if (fds[session._4_4_].revents != 0) {
          session._0_4_ = (int)session + 1;
        }
      }
      if ((int)session != 0) {
        _active_fds = 0;
      }
      gettimeofday((timeval *)&tv_end.tv_usec,(__timezone_ptr_t)0x0);
      iVar3 = poll((pollfd *)&stack0xfffffffffffff7b8,(ulong)nfds,(int)_active_fds);
      gettimeofday((timeval *)local_870,(__timezone_ptr_t)0x0);
      _active_fds = (_active_fds + ((long)local_870 - tv_end.tv_usec) * -1000) -
                    (tv_end.tv_sec - tv_begin.tv_sec) / 1000;
      if (0 < iVar3) {
        for (session._4_4_ = 0; session._4_4_ < nfds; session._4_4_ = session._4_4_ + 1) {
          uVar1 = fds[session._4_4_].type;
          if (uVar1 == '\x01') {
            fds[session._4_4_].revents = (long)sockets[(ulong)session._4_4_ - 1].revents;
            sockets[(ulong)session._4_4_ - 1].revents = 0;
            if (fds[session._4_4_].revents != 0) {
              session._0_4_ = (int)session + 1;
            }
          }
          else if (uVar1 == '\x02') {
            if ((sockets[(ulong)session._4_4_ - 1].events & 1U) != 0) {
              do {
                iVar3 = _libssh2_transport_read((fds[session._4_4_].fd.channel)->session);
              } while (0 < iVar3);
            }
            if ((sockets[(ulong)session._4_4_ - 1].revents & 0x10U) != 0) {
              fds[session._4_4_].revents = fds[session._4_4_].revents | 0x90;
            }
            sockets[(ulong)session._4_4_ - 1].revents = 0;
          }
          else if (uVar1 == '\x03') {
            if ((sockets[(ulong)session._4_4_ - 1].events & 1U) != 0) {
              do {
                iVar3 = _libssh2_transport_read((fds[session._4_4_].fd.listener)->session);
              } while (0 < iVar3);
            }
            if ((sockets[(ulong)session._4_4_ - 1].revents & 0x10U) != 0) {
              fds[session._4_4_].revents = fds[session._4_4_].revents | 0x90;
            }
            sockets[(ulong)session._4_4_ - 1].revents = 0;
          }
        }
      }
    } while (0 < _active_fds && (int)session == 0);
    fds_local._4_4_ = (int)session;
  }
  else {
    fds_local._4_4_ = -1;
  }
  return fds_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_poll(LIBSSH2_POLLFD * fds, unsigned int nfds, long timeout)
{
    long timeout_remaining;
    unsigned int i, active_fds;
#ifdef HAVE_POLL
    LIBSSH2_SESSION *session = NULL;
#ifdef HAVE_ALLOCA
    struct pollfd *sockets = alloca(sizeof(struct pollfd) * nfds);
#else
    struct pollfd sockets[256];

    if(nfds > 256)
        /* systems without alloca use a fixed-size array, this can be fixed if
           we really want to, at least if the compiler is a C99 capable one */
        return -1;
#endif
    /* Setup sockets for polling */
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch(fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            sockets[i].fd = fds[i].fd.socket;
            sockets[i].events = (short)fds[i].events;
            sockets[i].revents = 0;
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            sockets[i].fd = fds[i].fd.channel->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if(!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            sockets[i].fd = fds[i].fd.listener->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if(!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if(session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#elif defined(HAVE_SELECT)
    LIBSSH2_SESSION *session = NULL;
    libssh2_socket_t maxfd = 0;
    fd_set rfds, wfds;
    struct timeval tv;

    FD_ZERO(&rfds);
    FD_ZERO(&wfds);
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch(fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            if(fds[i].events & LIBSSH2_POLLFD_POLLIN) {
                FD_SET(fds[i].fd.socket, &rfds);
                if(fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            if(fds[i].events & LIBSSH2_POLLFD_POLLOUT) {
                FD_SET(fds[i].fd.socket, &wfds);
                if(fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            FD_SET(fds[i].fd.channel->session->socket_fd, &rfds);
            if(fds[i].fd.channel->session->socket_fd > maxfd)
                maxfd = fds[i].fd.channel->session->socket_fd;
            if(!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            FD_SET(fds[i].fd.listener->session->socket_fd, &rfds);
            if(fds[i].fd.listener->session->socket_fd > maxfd)
                maxfd = fds[i].fd.listener->session->socket_fd;
            if(!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if(session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#else
    /* No select() or poll()
     * no sockets structure to setup
     */

    timeout = 0;
#endif /* HAVE_POLL or HAVE_SELECT */

    timeout_remaining = timeout;
    do {
#if defined(HAVE_POLL) || defined(HAVE_SELECT)
        int sysret;
#endif

        active_fds = 0;

        for(i = 0; i < nfds; i++) {
            if(fds[i].events != fds[i].revents) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_CHANNEL:
                    if((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want to be ready for read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* Not yet known to be ready for read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      0) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if((fds[i].events & LIBSSH2_POLLFD_POLLEXT) &&
                        /* Want to be ready for extended read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLEXT) == 0)) {
                        /* Not yet known to be ready for extended read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      1) ?
                            LIBSSH2_POLLFD_POLLEXT : 0;
                    }
                    if((fds[i].events & LIBSSH2_POLLFD_POLLOUT) &&
                        /* Want to be ready for write */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLOUT) == 0)) {
                        /* Not yet known to be ready for write */
                        fds[i].revents |=
                            poll_channel_write(fds[i].fd. channel) ?
                            LIBSSH2_POLLFD_POLLOUT : 0;
                    }
                    if(fds[i].fd.channel->remote.close
                        || fds[i].fd.channel->local.close) {
                        fds[i].revents |= LIBSSH2_POLLFD_CHANNEL_CLOSED;
                    }
                    if(fds[i].fd.channel->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want a connection */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* No connections known of yet */
                        fds[i].revents |=
                            poll_listener_queued(fds[i].fd. listener) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if(fds[i].fd.listener->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;
                }
            }
            if(fds[i].revents) {
                active_fds++;
            }
        }

        if(active_fds) {
            /* Don't block on the sockets if we have channels/listeners which
               are ready */
            timeout_remaining = 0;
        }
#ifdef HAVE_POLL

        {
            struct timeval tv_begin, tv_end;

            gettimeofday(&tv_begin, NULL);
            sysret = poll(sockets, nfds, (int)timeout_remaining);
            gettimeofday(&tv_end, NULL);
            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }

        if(sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    fds[i].revents = sockets[i].revents;
                    sockets[i].revents = 0; /* In case we loop again, be
                                               nice */
                    if(fds[i].revents) {
                        active_fds++;
                    }
                    break;
                case LIBSSH2_POLLFD_CHANNEL:
                    if(sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      channel->session)
                              > 0);
                    }
                    if(sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                case LIBSSH2_POLLFD_LISTENER:
                    if(sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      listener->session)
                              > 0);
                    }
                    if(sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                }
            }
        }
#elif defined(HAVE_SELECT)
        tv.tv_sec = timeout_remaining / 1000;
#ifdef libssh2_usec_t
        tv.tv_usec = (libssh2_usec_t)((timeout_remaining % 1000) * 1000);
#else
        tv.tv_usec = (timeout_remaining % 1000) * 1000;
#endif

        {
            struct timeval tv_begin, tv_end;

            gettimeofday(&tv_begin, NULL);
            sysret = select((int)(maxfd + 1), &rfds, &wfds, NULL, &tv);
            gettimeofday(&tv_end, NULL);

            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }

        if(sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    if(FD_ISSET(fds[i].fd.socket, &rfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLIN;
                    }
                    if(FD_ISSET(fds[i].fd.socket, &wfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLOUT;
                    }
                    if(fds[i].revents) {
                        active_fds++;
                    }
                    break;

                case LIBSSH2_POLLFD_CHANNEL:
                    if(FD_ISSET(fds[i].fd.channel->session->socket_fd,
                                &rfds)) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      channel->session)
                              > 0);
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if(FD_ISSET
                        (fds[i].fd.listener->session->socket_fd, &rfds)) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      listener->session)
                              > 0);
                    }
                    break;
                }
            }
        }
#endif /* else no select() or poll() -- timeout (and by extension
        * timeout_remaining) will be equal to 0 */
    } while((timeout_remaining > 0) && !active_fds);

    return active_fds;
}